

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cc
# Opt level: O2

ssize_t __thiscall testbench::memory::write(memory *this,int __fd,void *__buf,size_t __n)

{
  __shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  ssize_t in_RAX;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  __shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<testbench::address_range> range;
  __shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var3 = &((this->ranges).
             super__Vector_base<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>;
  p_Var1 = &((this->ranges).
             super__Vector_base<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>;
  while( true ) {
    if (p_Var3 == p_Var1) {
      return in_RAX;
    }
    std::__shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,p_Var3);
    iVar2 = (*(local_40._M_ptr)->_vptr_address_range[1])();
    if (((char)iVar2 != '\0') &&
       (iVar2 = (*(local_40._M_ptr)->_vptr_address_range[2])(local_40._M_ptr,__fd),
       (char)iVar2 != '\0')) break;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    p_Var3 = p_Var3 + 1;
    in_RAX = extraout_RAX;
  }
  iVar2 = (**(local_40._M_ptr)->_vptr_address_range)();
  if ((char)iVar2 != '\0') {
    (*(local_40._M_ptr)->_vptr_address_range[4])(local_40._M_ptr,__fd,(ulong)__buf & 0xff);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return extraout_RAX_00;
}

Assistant:

void memory::write(unsigned address, unsigned char value) noexcept
{
    for (auto range : ranges) {
        if (range->is_visible() and range->contains(address)) {
            if (range->is_writable()) {
                range->write(address, value);
            }
            return;
        }
    }
}